

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall Builder::FinishCommand(Builder *this,Result *result,string *err)

{
  Edge *this_00;
  BuildStatus *pBVar1;
  DiskInterface *pDVar2;
  Metrics *this_01;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  Node **ppNVar6;
  Node **ppNVar7;
  reference ppNVar8;
  BuildLog *pBVar9;
  int *piVar10;
  char *pcVar11;
  reference ppNVar12;
  string *psVar13;
  DepsLog *this_02;
  Metric *local_2e8;
  allocator<char> local_2b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  long local_278;
  TimeStamp deps_mtime;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_268;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_260;
  const_iterator o_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  undefined1 local_210 [8];
  string rspfile;
  TimeStamp depfile_mtime;
  string depfile;
  TimeStamp input_mtime;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_1b8;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_1b0;
  iterator i;
  TimeStamp restat_mtime;
  TimeStamp new_mtime;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_190;
  iterator o;
  undefined1 local_180 [6];
  bool node_cleaned;
  byte local_159;
  Node **ppNStack_158;
  bool restat;
  TimeStamp output_mtime;
  int local_148;
  int local_144;
  int end_time;
  int start_time;
  string extract_err;
  string local_118;
  undefined1 local_f8 [8];
  string deps_prefix;
  string local_d0;
  undefined1 local_b0 [8];
  string deps_type;
  vector<Node_*,_std::allocator<Node_*>_> deps_nodes;
  Edge *edge;
  ScopedMetric metrics_h_scoped;
  bool local_4a;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *err_local;
  Result *result_local;
  Builder *this_local;
  
  local_28 = err;
  err_local = (string *)result;
  result_local = (Result *)this;
  if ((FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar4 = __cxa_guard_acquire(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                                   metrics_h_metric), this_01 = g_metrics, iVar4 != 0)) {
    metrics_h_scoped.start_._3_1_ = 0;
    local_4a = g_metrics == (Metrics *)0x0;
    if (local_4a) {
      local_2e8 = (Metric *)0x0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"FinishCommand",&local_49);
      metrics_h_scoped.start_._3_1_ = 1;
      local_2e8 = Metrics::NewMetric(this_01,&local_48);
    }
    local_4a = !local_4a;
    if ((metrics_h_scoped.start_._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_48);
    }
    if (local_4a) {
      std::allocator<char>::~allocator(&local_49);
    }
    FinishCommand::metrics_h_metric = local_2e8;
    __cxa_guard_release(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric((ScopedMetric *)&edge,FinishCommand::metrics_h_metric);
  this_00 = *(Edge **)err_local;
  std::vector<Node_*,_std::allocator<Node_*>_>::vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)((long)&deps_type.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"deps",(allocator<char> *)(deps_prefix.field_2._M_local_buf + 0xf))
  ;
  Edge::GetBinding((string *)local_b0,this_00,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)(deps_prefix.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"msvc_deps_prefix",
             (allocator<char> *)(extract_err.field_2._M_local_buf + 0xf));
  Edge::GetBinding((string *)local_f8,this_00,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)(extract_err.field_2._M_local_buf + 0xf));
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::__cxx11::string::string((string *)&end_time);
    bVar3 = ExtractDeps(this,(Result *)err_local,(string *)local_b0,(string *)local_f8,
                        (vector<Node_*,_std::allocator<Node_*>_> *)((long)&deps_type.field_2 + 8),
                        (string *)&end_time);
    if ((!bVar3) && (bVar3 = CommandRunner::Result::success((Result *)err_local), bVar3)) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::__cxx11::string::append((err_local->field_2)._M_local_buf);
      }
      std::__cxx11::string::append((string *)(err_local->field_2)._M_local_buf);
      *(undefined4 *)&err_local->_M_string_length = 1;
    }
    std::__cxx11::string::~string((string *)&end_time);
  }
  pBVar1 = this->status_;
  bVar3 = CommandRunner::Result::success((Result *)err_local);
  BuildStatus::BuildEdgeFinished
            (pBVar1,this_00,bVar3,(string *)&err_local->field_2,&local_144,&local_148);
  bVar3 = CommandRunner::Result::success((Result *)err_local);
  if (!bVar3) {
    this_local._7_1_ = Plan::EdgeFinished(&this->plan_,this_00,kEdgeFailed,local_28);
    output_mtime._4_4_ = 1;
    goto LAB_001125bb;
  }
  ppNStack_158 = (Node **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_180,"restat",(allocator<char> *)((long)&o._M_current + 7));
  bVar3 = Edge::GetBindingBool(this_00,(string *)local_180);
  std::__cxx11::string::~string((string *)local_180);
  std::allocator<char>::~allocator((allocator<char> *)((long)&o._M_current + 7));
  local_159 = bVar3;
  if (((byte)this->config_[4] & 1) == 0) {
    o._M_current._6_1_ = 0;
    local_190._M_current =
         (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&this_00->outputs_);
    while( true ) {
      new_mtime = (TimeStamp)std::vector<Node_*,_std::allocator<Node_*>_>::end(&this_00->outputs_);
      bVar3 = __gnu_cxx::operator!=
                        (&local_190,
                         (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                          *)&new_mtime);
      if (!bVar3) break;
      pDVar2 = this->disk_interface_;
      ppNVar8 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                ::operator*(&local_190);
      psVar13 = Node::path_abi_cxx11_(*ppNVar8);
      ppNVar6 = (Node **)(**(code **)(*(long *)pDVar2 + 0x18))(pDVar2,psVar13,local_28);
      if (ppNVar6 == (Node **)0xffffffffffffffff) {
        this_local._7_1_ = 0;
        output_mtime._4_4_ = 1;
        goto LAB_001125bb;
      }
      if ((long)ppNStack_158 < (long)ppNVar6) {
        ppNStack_158 = ppNVar6;
      }
      ppNVar8 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                ::operator*(&local_190);
      ppNVar7 = (Node **)Node::mtime(*ppNVar8);
      if ((ppNVar7 == ppNVar6) && ((local_159 & 1) != 0)) {
        ppNVar8 = __gnu_cxx::
                  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&local_190);
        bVar3 = Plan::CleanNode(&this->plan_,&this->scan_,*ppNVar8,local_28);
        if (!bVar3) {
          this_local._7_1_ = 0;
          output_mtime._4_4_ = 1;
          goto LAB_001125bb;
        }
        o._M_current._6_1_ = 1;
      }
      __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
      operator++(&local_190);
    }
    if ((o._M_current._6_1_ & 1) != 0) {
      i._M_current = (Node **)0x0;
      local_1b0._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&this_00->inputs_);
      while( true ) {
        input_mtime = (TimeStamp)
                      std::vector<Node_*,_std::allocator<Node_*>_>::end(&this_00->inputs_);
        local_1b8 = __gnu_cxx::
                    __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                    operator-((__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                               *)&input_mtime,(long)this_00->order_only_deps_);
        bVar3 = __gnu_cxx::operator!=(&local_1b0,&local_1b8);
        if (!bVar3) break;
        pDVar2 = this->disk_interface_;
        ppNVar8 = __gnu_cxx::
                  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&local_1b0);
        psVar13 = Node::path_abi_cxx11_(*ppNVar8);
        depfile.field_2._8_8_ = (**(code **)(*(long *)pDVar2 + 0x18))(pDVar2,psVar13,local_28);
        if ((Node **)depfile.field_2._8_8_ == (Node **)0xffffffffffffffff) {
          this_local._7_1_ = 0;
          output_mtime._4_4_ = 1;
          goto LAB_001125bb;
        }
        if ((long)i._M_current < (long)depfile.field_2._8_8_) {
          i._M_current = (Node **)depfile.field_2._8_8_;
        }
        __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
        operator++(&local_1b0);
      }
      Edge::GetUnescapedDepfile_abi_cxx11_((string *)&depfile_mtime,this_00);
      if (((i._M_current == (Node **)0x0) ||
          (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) ||
         (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) != 0)) {
LAB_00112094:
        pBVar1 = this->status_;
        iVar4 = Plan::command_edge_count(&this->plan_);
        BuildStatus::PlanHasTotalEdges(pBVar1,iVar4);
        ppNStack_158 = i._M_current;
        output_mtime._4_4_ = 0;
      }
      else {
        rspfile.field_2._8_8_ =
             (**(code **)(*(long *)this->disk_interface_ + 0x18))
                       (this->disk_interface_,&depfile_mtime,local_28);
        if ((Node **)rspfile.field_2._8_8_ != (Node **)0xffffffffffffffff) {
          if ((long)i._M_current < (long)rspfile.field_2._8_8_) {
            i._M_current = (Node **)rspfile.field_2._8_8_;
          }
          goto LAB_00112094;
        }
        this_local._7_1_ = 0;
        output_mtime._4_4_ = 1;
      }
      std::__cxx11::string::~string((string *)&depfile_mtime);
      if (output_mtime._4_4_ != 0) goto LAB_001125bb;
    }
  }
  bVar3 = Plan::EdgeFinished(&this->plan_,this_00,kEdgeSucceeded,local_28);
  if (!bVar3) {
    this_local._7_1_ = 0;
    output_mtime._4_4_ = 1;
    goto LAB_001125bb;
  }
  Edge::GetUnescapedRspfile_abi_cxx11_((string *)local_210,this_00);
  uVar5 = std::__cxx11::string::empty();
  if (((uVar5 & 1) == 0) && ((g_keep_rsp & 1U) == 0)) {
    (**(code **)(*(long *)this->disk_interface_ + 0x30))(this->disk_interface_,local_210);
  }
  pBVar9 = DependencyScan::build_log(&this->scan_);
  if (pBVar9 == (BuildLog *)0x0) {
LAB_00112300:
    uVar5 = std::__cxx11::string::empty();
    if (((uVar5 & 1) == 0) && (((byte)this->config_[4] & 1) == 0)) {
      bVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::empty(&this_00->outputs_);
      if (bVar3) {
        __assert_fail("!edge->outputs_.empty() && \"should have been rejected by parser\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                      ,0x40b,"bool Builder::FinishCommand(CommandRunner::Result *, string *)");
      }
      local_268._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&this_00->outputs_);
      __gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>::
      __normal_iterator<Node**>
                ((__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>> *)
                 &local_260,&local_268);
      while( true ) {
        deps_mtime = (TimeStamp)
                     std::vector<Node_*,_std::allocator<Node_*>_>::end(&this_00->outputs_);
        bVar3 = __gnu_cxx::operator!=
                          (&local_260,
                           (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                            *)&deps_mtime);
        if (!bVar3) break;
        pDVar2 = this->disk_interface_;
        ppNVar12 = __gnu_cxx::
                   __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                   operator*(&local_260);
        psVar13 = Node::path_abi_cxx11_(*ppNVar12);
        local_278 = (**(code **)(*(long *)pDVar2 + 0x18))(pDVar2,psVar13,local_28);
        if (local_278 == -1) {
          this_local._7_1_ = 0;
          goto LAB_0011259f;
        }
        this_02 = DependencyScan::deps_log(&this->scan_);
        ppNVar12 = __gnu_cxx::
                   __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                   operator*(&local_260);
        bVar3 = DepsLog::RecordDeps(this_02,*ppNVar12,local_278,
                                    (vector<Node_*,_std::allocator<Node_*>_> *)
                                    ((long)&deps_type.field_2 + 8));
        if (!bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2b8,"Error writing to deps log: ",&local_2b9);
          piVar10 = __errno_location();
          pcVar11 = strerror(*piVar10);
          std::operator+(&local_298,&local_2b8,pcVar11);
          std::__cxx11::string::operator=((string *)local_28,(string *)&local_298);
          std::__cxx11::string::~string((string *)&local_298);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::allocator<char>::~allocator(&local_2b9);
          this_local._7_1_ = 0;
          goto LAB_0011259f;
        }
        __gnu_cxx::__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
        operator++(&local_260);
      }
    }
    this_local._7_1_ = 1;
  }
  else {
    pBVar9 = DependencyScan::build_log(&this->scan_);
    bVar3 = BuildLog::RecordCommand(pBVar9,this_00,local_144,local_148,(TimeStamp)ppNStack_158);
    if (bVar3) goto LAB_00112300;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"Error writing to build log: ",
               (allocator<char> *)((long)&o_1._M_current + 7));
    piVar10 = __errno_location();
    pcVar11 = strerror(*piVar10);
    std::operator+(&local_230,&local_250,pcVar11);
    std::__cxx11::string::operator=((string *)local_28,(string *)&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator((allocator<char> *)((long)&o_1._M_current + 7));
    this_local._7_1_ = 0;
  }
LAB_0011259f:
  output_mtime._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_210);
LAB_001125bb:
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)local_b0);
  std::vector<Node_*,_std::allocator<Node_*>_>::~vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)((long)&deps_type.field_2 + 8));
  ScopedMetric::~ScopedMetric((ScopedMetric *)&edge);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Builder::FinishCommand(CommandRunner::Result* result, string* err) {
  METRIC_RECORD("FinishCommand");

  Edge* edge = result->edge;

  // First try to extract dependencies from the result, if any.
  // This must happen first as it filters the command output (we want
  // to filter /showIncludes output, even on compile failure) and
  // extraction itself can fail, which makes the command fail from a
  // build perspective.
  vector<Node*> deps_nodes;
  string deps_type = edge->GetBinding("deps");
  const string deps_prefix = edge->GetBinding("msvc_deps_prefix");
  if (!deps_type.empty()) {
    string extract_err;
    if (!ExtractDeps(result, deps_type, deps_prefix, &deps_nodes,
                     &extract_err) &&
        result->success()) {
      if (!result->output.empty())
        result->output.append("\n");
      result->output.append(extract_err);
      result->status = ExitFailure;
    }
  }

  int start_time, end_time;
  status_->BuildEdgeFinished(edge, result->success(), result->output,
                             &start_time, &end_time);

  // The rest of this function only applies to successful commands.
  if (!result->success()) {
    return plan_.EdgeFinished(edge, Plan::kEdgeFailed, err);
  }

  // Restat the edge outputs
  TimeStamp output_mtime = 0;
  bool restat = edge->GetBindingBool("restat");
  if (!config_.dry_run) {
    bool node_cleaned = false;

    for (vector<Node*>::iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o) {
      TimeStamp new_mtime = disk_interface_->Stat((*o)->path(), err);
      if (new_mtime == -1)
        return false;
      if (new_mtime > output_mtime)
        output_mtime = new_mtime;
      if ((*o)->mtime() == new_mtime && restat) {
        // The rule command did not change the output.  Propagate the clean
        // state through the build graph.
        // Note that this also applies to nonexistent outputs (mtime == 0).
        if (!plan_.CleanNode(&scan_, *o, err))
          return false;
        node_cleaned = true;
      }
    }

    if (node_cleaned) {
      TimeStamp restat_mtime = 0;
      // If any output was cleaned, find the most recent mtime of any
      // (existing) non-order-only input or the depfile.
      for (vector<Node*>::iterator i = edge->inputs_.begin();
           i != edge->inputs_.end() - edge->order_only_deps_; ++i) {
        TimeStamp input_mtime = disk_interface_->Stat((*i)->path(), err);
        if (input_mtime == -1)
          return false;
        if (input_mtime > restat_mtime)
          restat_mtime = input_mtime;
      }

      string depfile = edge->GetUnescapedDepfile();
      if (restat_mtime != 0 && deps_type.empty() && !depfile.empty()) {
        TimeStamp depfile_mtime = disk_interface_->Stat(depfile, err);
        if (depfile_mtime == -1)
          return false;
        if (depfile_mtime > restat_mtime)
          restat_mtime = depfile_mtime;
      }

      // The total number of edges in the plan may have changed as a result
      // of a restat.
      status_->PlanHasTotalEdges(plan_.command_edge_count());

      output_mtime = restat_mtime;
    }
  }

  if (!plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, err))
    return false;

  // Delete any left over response file.
  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty() && !g_keep_rsp)
    disk_interface_->RemoveFile(rspfile);

  if (scan_.build_log()) {
    if (!scan_.build_log()->RecordCommand(edge, start_time, end_time,
                                          output_mtime)) {
      *err = string("Error writing to build log: ") + strerror(errno);
      return false;
    }
  }

  if (!deps_type.empty() && !config_.dry_run) {
    assert(!edge->outputs_.empty() && "should have been rejected by parser");
    for (std::vector<Node*>::const_iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o) {
      TimeStamp deps_mtime = disk_interface_->Stat((*o)->path(), err);
      if (deps_mtime == -1)
        return false;
      if (!scan_.deps_log()->RecordDeps(*o, deps_mtime, deps_nodes)) {
        *err = std::string("Error writing to deps log: ") + strerror(errno);
        return false;
      }
    }
  }
  return true;
}